

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateMergeFromCodedStream
          (MessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  char *text;
  
  TVar1 = FieldDescriptor::type(this->descriptor_);
  text = 
  "DO_(::google::protobuf::internal::WireFormatLite::ReadGroupNoVirtual(\n      $number$, input, mutable_$name$()));\n"
  ;
  if (TVar1 == TYPE_MESSAGE) {
    text = 
    "DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(\n     input, mutable_$name$()));\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE) {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(\n"
      "     input, mutable_$name$()));\n");
  } else {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::ReadGroupNoVirtual(\n"
      "      $number$, input, mutable_$name$()));\n");
  }
}